

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestNestedRequiredForeign::Clear(TestNestedRequiredForeign *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_8a;
  byte local_89;
  LogMessage local_88;
  Voidify local_72;
  byte local_71;
  LogMessage local_70;
  Voidify local_5a;
  byte local_59;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestNestedRequiredForeign *pTStack_18;
  uint32_t cached_has_bits;
  TestNestedRequiredForeign *this_local;
  
  this_local = (TestNestedRequiredForeign *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0x3f) != 0) {
    if ((local_1c & 1) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.child_ == (TestNestedRequiredForeign *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x4ba4,"_impl_.child_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      Clear((this->field_0)._impl_.child_);
    }
    if ((local_1c & 2) != 0) {
      local_59 = 0;
      if ((this->field_0)._impl_.payload_ == (TestRequiredForeign *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x4ba8,"_impl_.payload_ != nullptr");
        local_59 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
      }
      if ((local_59 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      TestRequiredForeign::Clear((this->field_0)._impl_.payload_);
    }
    if ((local_1c & 4) != 0) {
      local_71 = 0;
      if ((this->field_0)._impl_.required_enum_ == (TestRequiredEnum *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x4bac,"_impl_.required_enum_ != nullptr");
        local_71 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_5a,pLVar2);
      }
      if ((local_71 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_70);
      }
      TestRequiredEnum::Clear((this->field_0)._impl_.required_enum_);
    }
    if ((local_1c & 8) != 0) {
      local_89 = 0;
      if ((this->field_0)._impl_.required_enum_no_mask_ == (TestRequiredEnumNoMask *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x4bb0,"_impl_.required_enum_no_mask_ != nullptr");
        local_89 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_72,pLVar2);
      }
      if ((local_89 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_88);
      }
      TestRequiredEnumNoMask::Clear((this->field_0)._impl_.required_enum_no_mask_);
    }
    if ((local_1c & 0x10) != 0) {
      local_a1 = 0;
      if ((this->field_0)._impl_.required_enum_multi_ == (TestRequiredEnumMulti *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x4bb4,"_impl_.required_enum_multi_ != nullptr");
        local_a1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_8a,pLVar2);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      TestRequiredEnumMulti::Clear((this->field_0)._impl_.required_enum_multi_);
    }
    if ((local_1c & 0x20) != 0) {
      if ((this->field_0)._impl_.required_no_mask_ == (TestRequiredNoMaskMulti *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x4bb8,"_impl_.required_no_mask_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      TestRequiredNoMaskMulti::Clear((this->field_0)._impl_.required_no_mask_);
    }
  }
  (this->field_0)._impl_.dummy_ = 0;
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestNestedRequiredForeign::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestNestedRequiredForeign)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.child_ != nullptr);
      _impl_.child_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.payload_ != nullptr);
      _impl_.payload_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.required_enum_ != nullptr);
      _impl_.required_enum_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.required_enum_no_mask_ != nullptr);
      _impl_.required_enum_no_mask_->Clear();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.required_enum_multi_ != nullptr);
      _impl_.required_enum_multi_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.required_no_mask_ != nullptr);
      _impl_.required_no_mask_->Clear();
    }
  }
  _impl_.dummy_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}